

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

bool wallet::RemoveWallet
               (WalletContext *context,shared_ptr<wallet::CWallet> *wallet,
               optional<bool> load_on_start,
               vector<bilingual_str,_std::allocator<bilingual_str>_> *warnings)

{
  element_type *peVar1;
  Chain *chain;
  pointer pcVar2;
  _Tuple_impl<0UL,_interfaces::Handler_*,_std::default_delete<interfaces::Handler>_> _Var3;
  shared_ptr<wallet::CWallet> *psVar4;
  __normal_iterator<std::shared_ptr<wallet::CWallet>_*,_std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>_>
  __position;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock5;
  string name;
  unique_lock<std::mutex> local_68;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  peVar1 = (wallet->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    __assert_fail("wallet",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                  ,0xa3,
                  "bool wallet::RemoveWallet(WalletContext &, const std::shared_ptr<CWallet> &, std::optional<bool>, std::vector<bilingual_str> &)"
                 );
  }
  chain = peVar1->m_chain;
  if (chain != (Chain *)0x0) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    pcVar2 = (peVar1->m_name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar2,pcVar2 + (peVar1->m_name)._M_string_length);
    peVar1 = (wallet->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    _Var3.super__Head_base<0UL,_interfaces::Handler_*,_false>._M_head_impl =
         (peVar1->m_chain_notifications_handler)._M_t.
         super___uniq_ptr_impl<interfaces::Handler,_std::default_delete<interfaces::Handler>_>._M_t.
         super__Tuple_impl<0UL,_interfaces::Handler_*,_std::default_delete<interfaces::Handler>_>.
         super__Head_base<0UL,_interfaces::Handler_*,_false>;
    (peVar1->m_chain_notifications_handler)._M_t.
    super___uniq_ptr_impl<interfaces::Handler,_std::default_delete<interfaces::Handler>_>._M_t.
    super__Tuple_impl<0UL,_interfaces::Handler_*,_std::default_delete<interfaces::Handler>_>.
    super__Head_base<0UL,_interfaces::Handler_*,_false> =
         (_Head_base<0UL,_interfaces::Handler_*,_false>)0x0;
    if (_Var3.super__Head_base<0UL,_interfaces::Handler_*,_false>._M_head_impl != (Handler *)0x0) {
      (**(code **)(*(long *)_Var3.super__Head_base<0UL,_interfaces::Handler_*,_false>._M_head_impl +
                  8))();
    }
    local_68._M_device = &(context->wallets_mutex).super_mutex;
    local_68._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_68);
    __position = std::
                 __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<wallet::CWallet>*,std::vector<std::shared_ptr<wallet::CWallet>,std::allocator<std::shared_ptr<wallet::CWallet>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<wallet::CWallet>const>>
                           ((context->wallets).
                            super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (context->wallets).
                            super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,wallet);
    psVar4 = (context->wallets).
             super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current == psVar4) {
      std::unique_lock<std::mutex>::~unique_lock(&local_68);
    }
    else {
      std::
      vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>::
      _M_erase(&context->wallets,(iterator)__position._M_current);
      std::unique_lock<std::mutex>::~unique_lock(&local_68);
      boost::signals2::
      signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
      ::operator()(&((wallet->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->NotifyUnload);
      UpdateWalletSetting(chain,&local_58,load_on_start,warnings);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return __position._M_current != psVar4;
    }
    __stack_chk_fail();
  }
  __assert_fail("m_chain",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                ,0x1f5,"interfaces::Chain &wallet::CWallet::chain() const");
}

Assistant:

bool RemoveWallet(WalletContext& context, const std::shared_ptr<CWallet>& wallet, std::optional<bool> load_on_start, std::vector<bilingual_str>& warnings)
{
    assert(wallet);

    interfaces::Chain& chain = wallet->chain();
    std::string name = wallet->GetName();

    // Unregister with the validation interface which also drops shared pointers.
    wallet->m_chain_notifications_handler.reset();
    {
        LOCK(context.wallets_mutex);
        std::vector<std::shared_ptr<CWallet>>::iterator i = std::find(context.wallets.begin(), context.wallets.end(), wallet);
        if (i == context.wallets.end()) return false;
        context.wallets.erase(i);
    }
    // Notify unload so that upper layers release the shared pointer.
    wallet->NotifyUnload();

    // Write the wallet setting
    UpdateWalletSetting(chain, name, load_on_start, warnings);

    return true;
}